

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O0

void djgt__flipy(djg_texture *texture)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  undefined1 local_78 [8];
  char tmp [64];
  char *tx2;
  char *tx1;
  int local_18;
  int bpp;
  int y;
  int x;
  djg_texture *texture_local;
  
  iVar6 = texture->comp * texture->pf;
  for (bpp = 0; bpp < texture->x; bpp = bpp + 1) {
    for (local_18 = 0; local_18 < texture->y / 2; local_18 = local_18 + 1) {
      pcVar4 = texture->texels;
      iVar1 = texture->x;
      pcVar5 = texture->texels;
      iVar2 = texture->x;
      iVar3 = texture->y;
      memcpy(local_78,pcVar4 + iVar6 * (iVar1 * local_18 + bpp),(long)iVar6);
      memcpy(pcVar4 + iVar6 * (iVar1 * local_18 + bpp),
             pcVar5 + iVar6 * (iVar2 * ((iVar3 + -1) - local_18) + bpp),(long)iVar6);
      memcpy(pcVar5 + iVar6 * (iVar2 * ((iVar3 + -1) - local_18) + bpp),local_78,(long)iVar6);
    }
  }
  return;
}

Assistant:

static void djgt__flipy(djg_texture *texture)
{
    int x, y, bpp = texture->comp * texture->pf;

    for (x = 0; x < texture->x; ++x)
    for (y = 0; y < texture->y / 2; ++y) {
        char *tx1 = &texture->texels[bpp * (texture->x * y + x)];
        char *tx2 = &texture->texels[bpp * (texture->x * (texture->y - 1 - y) + x)];
        char tmp[64];

        memcpy(tmp, tx1, bpp);
        memcpy(tx1, tx2, bpp);
        memcpy(tx2, tmp, bpp);
    }
}